

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O1

void __thiscall
BamTools::Variant::Variant<std::__cxx11::string>
          (Variant *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  pointer pcVar1;
  ImplBase *pIVar2;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pIVar2 = (ImplBase *)operator_new(0x30);
  pcVar1 = (v->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + v->_M_string_length)
  ;
  pIVar2->refs = 0;
  pIVar2->_vptr_ImplBase = (_func_int **)&PTR__Impl_001b3d78;
  pIVar2[1]._vptr_ImplBase = (_func_int **)(pIVar2 + 2);
  std::__cxx11::string::_M_construct<char*>((string *)(pIVar2 + 1),local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  this->data = pIVar2;
  pIVar2->refs = pIVar2->refs + 1;
  return;
}

Assistant:

Variant(T v)
        : data(new Impl<T>(v))
    {
        data->AddRef();
    }